

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_float_suite::test_linear_increase(void)

{
  float *lhs;
  float local_38 [2];
  
  lhs = local_38 + 1;
  local_38[0] = 1.0;
  local_38[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xf9,"void mean_float_suite::test_linear_increase()",lhs,local_38);
  local_38[0] = 1.53333;
  local_38[1] = 1.5333333;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","1.53333f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xfb,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 2.08876;
  local_38[1] = 2.0887575;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","2.08876f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xfd,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 2.66608;
  local_38[1] = 2.6660767;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","2.66608f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xff,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 3.52165;
  local_38[1] = 3.5216465;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","3.52165f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x101,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 3.8569;
  local_38[1] = 3.8569016;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","3.85690f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x103,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 4.50384;
  local_38[1] = 4.5038385;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","4.50384f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x105,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 5.16963;
  local_38[1] = 5.169631;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.16963f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x107,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 5.85427;
  local_38[1] = 5.854269;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.85427f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x109,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 6.55748;
  local_38[1] = 6.5574837;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","6.55748f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x10b,"void mean_float_suite::test_linear_increase()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  return;
}

Assistant:

void test_linear_increase()
{
    const auto tolerance = detail::close_to<float>(1e-5f);
    decay::moment<float> filter(one_over_eight);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(2.0f);
    TRIAL_TEST_WITH(filter.mean(), 1.53333f, tolerance);
    filter.push(3.0f);
    TRIAL_TEST_WITH(filter.mean(), 2.08876f, tolerance);
    filter.push(4.0f);
    TRIAL_TEST_WITH(filter.mean(), 2.66608f, tolerance);
    filter.push(6.0f);
    TRIAL_TEST_WITH(filter.mean(), 3.52165f, tolerance);
    filter.push(5.0f);
    TRIAL_TEST_WITH(filter.mean(), 3.85690f, tolerance);
    filter.push(7.0f);
    TRIAL_TEST_WITH(filter.mean(), 4.50384f, tolerance);
    filter.push(8.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.16963f, tolerance);
    filter.push(9.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.85427f, tolerance);
    filter.push(10.0f);
    TRIAL_TEST_WITH(filter.mean(), 6.55748f, tolerance);
}